

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sphere.cpp
# Opt level: O3

bool __thiscall CGL::SceneObjects::Sphere::intersect(Sphere *this,Ray *r,Intersection *i)

{
  double dVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  double dVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  double t1;
  double t2;
  double local_30;
  double local_28;
  
  bVar2 = test(this,r,&local_30,&local_28);
  if (bVar2) {
    auVar5._8_8_ = local_30;
    auVar5._0_8_ = local_30;
    dVar4 = (double)vmovlps_avx(auVar5);
    r->max_t = dVar4;
    iVar3 = (*(this->super_Primitive)._vptr_Primitive[3])(this);
    i->bsdf = (BSDF *)CONCAT44(extraout_var,iVar3);
    i->primitive = &this->super_Primitive;
    dVar4 = (double)vmovlpd_avx(auVar5);
    i->t = dVar4;
    auVar6._0_8_ = local_30 * (r->d).field_0.field_0.x + (r->o).field_0.field_0.x;
    auVar6._8_8_ = local_30 * (r->d).field_0.field_0.y + (r->o).field_0.field_0.y;
    auVar6 = vsubpd_avx(auVar6,*(undefined1 (*) [16])(this->o).field_0.field_2.__vec);
    dVar1 = (local_30 * (r->d).field_0.field_0.z + (r->o).field_0.field_0.z) -
            (this->o).field_0.field_0.z;
    auVar5 = vdppd_avx(auVar6,auVar6,0x31);
    dVar4 = dVar1 * dVar1 + auVar5._0_8_;
    if (dVar4 < 0.0) {
      dVar4 = sqrt(dVar4);
    }
    else {
      auVar7._8_8_ = 0;
      auVar7._0_8_ = dVar4;
      auVar5 = vsqrtsd_avx(auVar7,auVar7);
      dVar4 = auVar5._0_8_;
    }
    dVar4 = 1.0 / dVar4;
    (i->n).field_0.field_0.x = auVar6._0_8_ * dVar4;
    (i->n).field_0.field_0.y = auVar6._8_8_ * dVar4;
    (i->n).field_0.field_0.z = dVar1 * dVar4;
  }
  return bVar2;
}

Assistant:

bool Sphere::intersect(const Ray &r, Intersection *i) const {

  // TODO (Part 1.4):
  // Implement ray - sphere intersection.
  // Note again that you might want to use the the Sphere::test helper here.
  // When an intersection takes place, the Intersection data should be updated
  // correspondingly.
  double t1, t2;
  if (! test(r, t1, t2) ) {
    return false;
  }

  r.max_t = t1;

  // populate isect
  i->bsdf = this->get_bsdf();
  i->primitive = this;
  i->t = t1;

  // get normal vector and save to isect
  Vector3D isect_p = r.o + t1 * r.d;
  i->n = this->normal(isect_p);

  return true;
}